

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O0

bool __thiscall Incppect<true>::Impl::hasExt(Impl *this,string_view file,string_view ext)

{
  size_type sVar1;
  size_type sVar2;
  reverse_iterator<const_char_*> *in_RCX;
  reverse_iterator<const_char_*> *in_RDI;
  reverse_iterator<const_char_*> *in_R8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  bool local_1;
  
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  if (sVar2 < sVar1) {
    local_1 = false;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::rbegin(in_stack_ffffffffffffffb8);
    std::basic_string_view<char,_std::char_traits<char>_>::rend(in_stack_ffffffffffffffb8);
    std::basic_string_view<char,_std::char_traits<char>_>::rbegin(in_stack_ffffffffffffffb8);
    local_1 = std::equal<std::reverse_iterator<char_const*>,std::reverse_iterator<char_const*>>
                        (in_R8,in_RCX,in_RDI);
  }
  return local_1;
}

Assistant:

inline bool hasExt(std::string_view file, std::string_view ext) {
        if (ext.size() > file.size()) {
            return false;
        }
        return std::equal(ext.rbegin(), ext.rend(), file.rbegin());
    }